

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiLabelFileParser.cpp
# Opt level: O3

void __thiscall
MultiLabelFileParser::writeLabelList(MultiLabelFileParser *this,string *labelListFilename)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ofstream labelListFp;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)labelListFilename);
  uVar3 = this->_L;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      if ((this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 0) {
        lVar5 = 8;
        uVar6 = 0;
        do {
          lVar1 = *(long *)&(this->_labelList).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,*(char **)(lVar1 + -8 + lVar5),*(long *)(lVar1 + lVar5));
          uVar3 = (this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar4];
          if (uVar6 != uVar3 - 1) {
            local_231 = ',';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
            uVar3 = (this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar4];
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x20;
        } while (uVar6 < uVar3);
        uVar3 = this->_L;
      }
      if (uVar4 != uVar3 - 1) {
        cVar2 = (char)(string *)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        uVar3 = this->_L;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MultiLabelFileParser::writeLabelList(string labelListFilename)const{//{{{
    ofstream labelListFp;
    labelListFp.open(labelListFilename,ios::out);
    for(int l=0; l<_L; l++){
        for(int c=0; c<_C[l]; c++){
            labelListFp<<_labelList[l][c];
            if(c != (_C[l]-1))labelListFp<<',';
        }
        if(l != (_L-1))labelListFp<<endl;
    }
    labelListFp.close();
}